

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionState.h
# Opt level: O1

UtcTimeStamp * __thiscall
FIX::SessionState::getCreationTime(UtcTimeStamp *__return_storage_ptr__,SessionState *this)

{
  int iVar1;
  
  Mutex::lock(&this->m_mutex);
  (*this->m_pStore->_vptr_MessageStore[10])(__return_storage_ptr__);
  iVar1 = (this->m_mutex).m_count;
  (this->m_mutex).m_count = iVar1 + -1;
  if (iVar1 < 2) {
    (this->m_mutex).m_threadID = 0;
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
  }
  return __return_storage_ptr__;
}

Assistant:

UtcTimeStamp getCreationTime() const EXCEPT ( IOException )
  { Locker l( m_mutex ); return m_pStore->getCreationTime(); }